

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_busy_handler(sqlite3 *db,_func_int_void_ptr_int *xBusy,void *pArg)

{
  sqlite3_mutex *psVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    (db->busyHandler).xFunc = xBusy;
    (db->busyHandler).pArg = pArg;
    (db->busyHandler).nBusy = 0;
    db->busyTimeout = 0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar1 = db->mutex;
    (db->busyHandler).xFunc = xBusy;
    (db->busyHandler).pArg = pArg;
    (db->busyHandler).nBusy = 0;
    db->busyTimeout = 0;
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_handler(
  sqlite3 *db,
  int (*xBusy)(void*,int),
  void *pArg
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->busyHandler.xFunc = xBusy;
  db->busyHandler.pArg = pArg;
  db->busyHandler.nBusy = 0;
  db->busyTimeout = 0;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}